

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O1

void __thiscall cmCTest::SetStopTime(cmCTest *this,string *time_str)

{
  int iVar1;
  int iVar2;
  tm *ptVar3;
  time_t tVar4;
  time_t tVar5;
  int iVar6;
  int iVar7;
  time_t current_time;
  char buf [1024];
  time_t local_430;
  char local_428 [1024];
  
  local_430 = time((time_t *)0x0);
  ptVar3 = gmtime(&local_430);
  iVar1 = ptVar3->tm_hour;
  tVar4 = mktime(ptVar3);
  ptVar3 = localtime(&local_430);
  iVar2 = ptVar3->tm_hour;
  iVar6 = iVar2 - iVar1;
  if ((iVar6 == 0 || iVar2 < iVar1) || tVar4 <= local_430) {
    iVar7 = iVar6 + 0x18;
    if (iVar1 <= iVar2) {
      iVar7 = iVar6;
    }
    if (local_430 <= tVar4) {
      iVar7 = iVar6;
    }
  }
  else {
    iVar7 = iVar6 + -0x18;
  }
  sprintf(local_428,"%d%02d%02d %s %+05i",(ulong)(ptVar3->tm_year + 0x76c),
          (ulong)(ptVar3->tm_mon + 1),(ulong)(uint)ptVar3->tm_mday,(time_str->_M_dataplus)._M_p,
          iVar7 * 100);
  tVar5 = curl_getdate(local_428,&local_430);
  if (tVar5 == -1) {
    (this->StopTime).__d.__r = 0;
  }
  else {
    (this->StopTime).__d.__r = tVar5 * 1000000000;
    if (tVar5 < local_430) {
      (this->StopTime).__d.__r = tVar5 * 1000000000 + 86400000000000;
    }
  }
  return;
}

Assistant:

void cmCTest::SetStopTime(std::string const& time_str)
{

  struct tm* lctime;
  time_t current_time = time(nullptr);
  lctime = gmtime(&current_time);
  int gm_hour = lctime->tm_hour;
  time_t gm_time = mktime(lctime);
  lctime = localtime(&current_time);
  int local_hour = lctime->tm_hour;

  int tzone_offset = local_hour - gm_hour;
  if (gm_time > current_time && gm_hour < local_hour) {
    // this means gm_time is on the next day
    tzone_offset -= 24;
  } else if (gm_time < current_time && gm_hour > local_hour) {
    // this means gm_time is on the previous day
    tzone_offset += 24;
  }

  tzone_offset *= 100;
  char buf[1024];
  sprintf(buf, "%d%02d%02d %s %+05i", lctime->tm_year + 1900,
          lctime->tm_mon + 1, lctime->tm_mday, time_str.c_str(), tzone_offset);

  time_t stop_time = curl_getdate(buf, &current_time);
  if (stop_time == -1) {
    this->StopTime = std::chrono::system_clock::time_point();
    return;
  }
  this->StopTime = std::chrono::system_clock::from_time_t(stop_time);

  if (stop_time < current_time) {
    this->StopTime += std::chrono::hours(24);
  }
}